

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86CMPLESD(uchar *stream,x86XmmReg dst,x86XmmReg src)

{
  byte bVar1;
  bool bVar2;
  
  *stream = 0xf2;
  bVar1 = 7 < (int)src | (7 < (int)dst) << 2;
  bVar2 = bVar1 != 0;
  if (bVar2) {
    stream[1] = bVar1 | 0x40;
  }
  (stream + (ulong)bVar2 + 1)[0] = '\x0f';
  (stream + (ulong)bVar2 + 1)[1] = 0xc2;
  stream[(ulong)bVar2 + 3] = ((byte)src & 7) + (char)dst * '\b' | 0xc0;
  stream[(ulong)bVar2 + 4] = '\x02';
  return (((int)(stream + 1) + (uint)bVar2) - (int)stream) + 4;
}

Assistant:

int x86CMPLESD(unsigned char *stream, x86XmmReg dst, x86XmmReg src)
{
	unsigned char *start = stream;

	*stream++ = 0xf2;
	stream += encodeRex(stream, false, dst, src);
	*stream++ = 0x0f;
	*stream++ = 0xc2;
	*stream++ = encodeRegister(src, dst);
	*stream++ = 2;

	return int(stream - start);
}